

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_boost_po::add_to_description<char>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<char>_> *opt,
          options_description *options_description)

{
  bool bVar1;
  element_type *peVar2;
  value_semantic *pvVar3;
  typed_value<std::vector<char,_std::allocator<char>_>,_char> *ptVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar5;
  shared_ptr<VW::config::typed_option<char>_> *opt_00;
  long in_RDI;
  string boost_option_name;
  shared_ptr<VW::config::typed_option<char>_> *in_stack_ffffffffffffff48;
  options_boost_po *in_stack_ffffffffffffff50;
  key_type *in_stack_ffffffffffffff58;
  undefined8 local_58;
  undefined8 local_50 [3];
  string local_38 [56];
  
  peVar2 = std::
           __shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x341873);
  std::__cxx11::string::string(local_38,(string *)&(peVar2->super_base_option).m_name);
  std::__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x341891);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
  if (bVar1) {
    std::__cxx11::string::operator+=(local_38,",");
    peVar2 = std::
             __shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3418d4);
    std::__cxx11::string::operator+=(local_38,(string *)&(peVar2->super_base_option).m_short_name);
  }
  local_50[0] = boost::program_options::options_description::add_options();
  pvVar3 = (value_semantic *)std::__cxx11::string::c_str();
  ptVar4 = convert_to_boost_value<char>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x34195c);
  std::__cxx11::string::c_str();
  boost::program_options::options_description_easy_init::operator()
            ((char *)local_50,pvVar3,(char *)ptVar4);
  this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(in_RDI + 0x2b8);
  std::__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x34199b);
  sVar5 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::count(this_00,in_stack_ffffffffffffff58);
  if (sVar5 == 0) {
    local_58 = boost::program_options::options_description::add_options();
    opt_00 = (shared_ptr<VW::config::typed_option<char>_> *)std::__cxx11::string::c_str();
    ptVar4 = convert_to_boost_value<char>(in_stack_ffffffffffffff50,opt_00);
    boost::program_options::options_description_easy_init::operator()
              ((char *)&local_58,(value_semantic *)opt_00,(char *)ptVar4);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void options_boost_po::add_to_description(
    std::shared_ptr<typed_option<T>> opt, po::options_description& options_description)
{
  std::string boost_option_name = opt->m_name;
  if (opt->m_short_name != "")
  {
    boost_option_name += ",";
    boost_option_name += opt->m_short_name;
  }
  options_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), opt->m_help.c_str());

  if (m_defined_options.count(opt->m_name) == 0)
  {
    // TODO may need to add noop notifier here.
    master_description.add_options()(boost_option_name.c_str(), convert_to_boost_value(opt), "");
  }
}